

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::PathDescriptionSyntax::PathDescriptionSyntax
          (PathDescriptionSyntax *this,Token openParen,Token edgeIdentifier,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs,Token polarityOperator,
          Token pathOperator,PathSuffixSyntax *suffix,Token closeParen)

{
  PathSuffixSyntax *pPVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  NameSyntax *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  size_t index;
  
  uVar6 = edgeIdentifier._0_8_;
  uVar7 = openParen._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = PathDescription;
  (this->openParen).kind = (short)uVar7;
  (this->openParen).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->openParen).info = openParen.info;
  (this->edgeIdentifier).kind = (short)uVar6;
  (this->edgeIdentifier).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->edgeIdentifier).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->edgeIdentifier).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->edgeIdentifier).info = edgeIdentifier.info;
  SVar3 = (inputs->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(inputs->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent =
       (inputs->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->inputs).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->inputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->inputs).super_SyntaxListBase.childCount = (inputs->super_SyntaxListBase).childCount;
  (this->inputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ece40;
  sVar2 = (inputs->elements).size_;
  (this->inputs).elements.data_ = (inputs->elements).data_;
  (this->inputs).elements.size_ = sVar2;
  (this->polarityOperator).kind = polarityOperator.kind;
  (this->polarityOperator).field_0x2 = polarityOperator._2_1_;
  (this->polarityOperator).numFlags = (NumericTokenFlags)polarityOperator.numFlags.raw;
  (this->polarityOperator).rawLen = polarityOperator.rawLen;
  (this->polarityOperator).info = polarityOperator.info;
  (this->pathOperator).kind = pathOperator.kind;
  (this->pathOperator).field_0x2 = pathOperator._2_1_;
  (this->pathOperator).numFlags = (NumericTokenFlags)pathOperator.numFlags.raw;
  (this->pathOperator).rawLen = pathOperator.rawLen;
  (this->pathOperator).info = pathOperator.info;
  (this->suffix).ptr = suffix;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar8 = (this->inputs).elements.size_ + 1;
  if (1 < uVar8) {
    index = 0;
    do {
      pNVar5 = SeparatedSyntaxList<slang::syntax::NameSyntax>::operator[](&this->inputs,index);
      (pNVar5->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
      index = index + 1;
    } while (uVar8 >> 1 != index);
  }
  pPVar1 = (this->suffix).ptr;
  if (pPVar1 != (PathSuffixSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = &this->super_SyntaxNode;
    return;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<slang::syntax::PathSuffixSyntax *>::get() const [T = slang::syntax::PathSuffixSyntax *]"
            );
}

Assistant:

PathDescriptionSyntax(Token openParen, Token edgeIdentifier, const SeparatedSyntaxList<NameSyntax>& inputs, Token polarityOperator, Token pathOperator, PathSuffixSyntax& suffix, Token closeParen) :
        SyntaxNode(SyntaxKind::PathDescription), openParen(openParen), edgeIdentifier(edgeIdentifier), inputs(inputs), polarityOperator(polarityOperator), pathOperator(pathOperator), suffix(&suffix), closeParen(closeParen) {
        this->inputs.parent = this;
        for (auto child : this->inputs)
            child->parent = this;
        this->suffix->parent = this;
    }